

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

char * MULTILABEL::bufread_label(labels *ld,char *c,io_buf *cache)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ostream *this;
  ulong *n;
  ulong *in_RSI;
  char **in_RDI;
  uint32_t temp;
  size_t i;
  size_t total;
  size_t num;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ulong local_38;
  io_buf *in_stack_fffffffffffffff8;
  
  uVar1 = *in_RSI;
  v_array<unsigned_int>::clear
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
  ;
  n = in_RSI + 1;
  sVar3 = io_buf::buf_read(in_stack_fffffffffffffff8,in_RDI,(size_t)n);
  if (sVar3 < uVar1 << 2) {
    this = std::operator<<((ostream *)&std::cout,"error in demarshal of cost data");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
      uVar2 = *n;
      n = (ulong *)((long)n + 4);
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)CONCAT44((int)uVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
  }
  return (char *)n;
}

Assistant:

char* bufread_label(labels* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->label_v.clear();
  c += sizeof(size_t);
  size_t total = sizeof(uint32_t) * num;
  if (cache.buf_read(c, (int)total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    uint32_t temp = *(uint32_t*)c;
    c += sizeof(uint32_t);
    ld->label_v.push_back(temp);
  }

  return c;
}